

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commonFunc.h
# Opt level: O0

size_t gen_random_node_by_weight_LT(Edgelist *edges)

{
  size_type sVar1;
  const_reference pvVar2;
  size_t __n;
  double dVar3;
  float meanWeight;
  size_t meanIdx;
  size_t maxIdx;
  size_t minIdx;
  double weight;
  Edgelist *edges_local;
  double *psfmt64;
  double r;
  
  if (0x17d < dsfmt_global_data.idx) {
    dsfmt_gen_rand_all(&dsfmt_global_data);
    dsfmt_global_data.idx = 0;
  }
  dVar3 = 2.0 - dsfmt_global_data.status[0].d[dsfmt_global_data.idx];
  maxIdx = 0;
  dsfmt_global_data.idx = dsfmt_global_data.idx + 1;
  sVar1 = std::
          vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>::
          size(edges);
  pvVar2 = std::
           vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
           ::front(edges);
  if ((double)pvVar2->second <= dVar3) {
    pvVar2 = std::
             vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
             ::back(edges);
    __n = sVar1 - 1;
    if (dVar3 <= (double)pvVar2->second) {
      while (meanIdx = __n, maxIdx < meanIdx) {
        __n = maxIdx + meanIdx >> 1;
        pvVar2 = std::
                 vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                 ::operator[](edges,__n);
        if ((double)pvVar2->second < dVar3) {
          maxIdx = __n + 1;
          __n = meanIdx;
        }
      }
      edges_local = (Edgelist *)meanIdx;
    }
    else {
      sVar1 = std::
              vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
              ::size(edges);
      edges_local = (Edgelist *)(sVar1 + 1);
    }
  }
  else {
    edges_local = (Edgelist *)0x0;
  }
  return (size_t)edges_local;
}

Assistant:

static inline size_t gen_random_node_by_weight_LT(const Edgelist& edges)
{
    const double weight = dsfmt_gv_genrand_open_close();
    size_t minIdx = 0, maxIdx = edges.size() - 1;
    if (weight < edges.front().second) return 0; // First element
    if (weight > edges.back().second) return edges.size() + 1; // No element
    while (maxIdx > minIdx)
    {
        const size_t meanIdx = (minIdx + maxIdx) / 2;
        const auto meanWeight = edges[meanIdx].second;
        if (weight <= meanWeight) maxIdx = meanIdx;
        else minIdx = meanIdx + 1;
    }
    return maxIdx;
}